

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O1

string * Color::strip(string *__return_storage_ptr__,string *input)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  sVar2 = input->_M_string_length;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar5 = (uint)sVar2;
  if (0 < (int)uVar5) {
    uVar4 = 0;
    bVar6 = false;
    do {
      cVar1 = (input->_M_dataplus)._M_p[uVar4];
      if (bVar6) {
        bVar3 = bVar6;
        if (cVar1 == 'm') {
          bVar3 = false;
        }
      }
      else {
        bVar3 = true;
        if (cVar1 != '\x1b') {
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          bVar3 = bVar6;
        }
      }
      bVar6 = bVar3;
      uVar4 = uVar4 + 1;
    } while ((uVar5 & 0x7fffffff) != uVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Color::strip (const std::string& input)
{
#ifdef FEATURE_COLOR
  int length = input.length ();
  bool inside = false;
  std::string output;
  for (int i = 0; i < length; ++i)
  {
    if (inside)
    {
      if (input[i] == 'm')
        inside = false;
    }
    else
    {
      if (input[i] == 033)
        inside = true;
      else
        output += input[i];
    }
  }

  return output;
#else
  return input;
#endif
}